

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O3

HTMLElement * __thiscall choc::html::HTMLElement::setID(HTMLElement *this,string_view value)

{
  HTMLElement *pHVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"id","");
  pHVar1 = setProperty(this,&local_48,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pHVar1;
}

Assistant:

HTMLElement& setID (std::string_view value)         { return setProperty ("id", std::move (value)); }